

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseVersions.h
# Opt level: O1

void __thiscall
glslang::TParseVersions::TParseVersions
          (TParseVersions *this,TIntermediate *interm,int version,EProfile profile,
          SpvVersion *spvVersion,EShLanguage language,TInfoSink *infoSink,bool forwardCompatible,
          EShMessages messages)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined3 uVar5;
  TPoolAllocator *pTVar6;
  
  this->_vptr_TParseVersions = (_func_int **)&PTR__TParseVersions_0093b748;
  this->forwardCompatible = forwardCompatible;
  this->profile = profile;
  this->infoSink = infoSink;
  this->version = version;
  this->language = language;
  iVar2 = spvVersion->vulkanGlsl;
  iVar3 = spvVersion->vulkan;
  iVar4 = spvVersion->openGl;
  (this->spvVersion).spv = spvVersion->spv;
  (this->spvVersion).vulkanGlsl = iVar2;
  (this->spvVersion).vulkan = iVar3;
  (this->spvVersion).openGl = iVar4;
  uVar5 = *(undefined3 *)&spvVersion->field_0x11;
  (this->spvVersion).vulkanRelaxed = spvVersion->vulkanRelaxed;
  *(undefined3 *)&(this->spvVersion).field_0x11 = uVar5;
  this->intermediate = interm;
  pTVar6 = GetThreadPoolAllocator();
  (this->extensionBehavior).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
  ._M_t._M_impl.super__Node_allocator.allocator = pTVar6;
  p_Var1 = &(this->extensionBehavior).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->extensionBehavior).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->extensionBehavior).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->extensionBehavior).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->extensionBehavior).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->extensionBehavior).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar6 = GetThreadPoolAllocator();
  (this->extensionMinSpv).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>_>
  ._M_t._M_impl.super__Node_allocator.allocator = pTVar6;
  p_Var1 = &(this->extensionMinSpv).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->extensionMinSpv).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->extensionMinSpv).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->extensionMinSpv).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->extensionMinSpv).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->extensionMinSpv).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->spvUnsupportedExt).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  (this->spvUnsupportedExt).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->spvUnsupportedExt).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->spvUnsupportedExt).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar6 = GetThreadPoolAllocator();
  (this->spvUnsupportedExt).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Tp_alloc_type.allocator = pTVar6;
  (this->spvUnsupportedExt).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->spvUnsupportedExt).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->spvUnsupportedExt).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->messages = messages;
  this->numErrors = 0;
  this->currentScanner = (TInputScanner *)0x0;
  return;
}

Assistant:

TParseVersions(TIntermediate& interm, int version, EProfile profile,
                   const SpvVersion& spvVersion, EShLanguage language, TInfoSink& infoSink,
                   bool forwardCompatible, EShMessages messages)
        :
        forwardCompatible(forwardCompatible),
        profile(profile),
        infoSink(infoSink), version(version), 
        language(language),
        spvVersion(spvVersion), 
        intermediate(interm), messages(messages), numErrors(0), currentScanner(nullptr) { }